

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

string * __thiscall NDeviceChannel::getPrintStr_abi_cxx11_(NDeviceChannel *this,int indent)

{
  ostream *poVar1;
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  string indentStr;
  ostringstream oss;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  allocator local_1b1;
  string local_1b0 [32];
  ostringstream local_190 [380];
  int local_14;
  
  local_14 = in_EDX;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"    ",&local_1b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  for (local_1c8 = 0; local_1c8 < local_14; local_1c8 = local_1c8 + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  std::operator<<((ostream *)local_190,"Printing \'NDevice Channel\'\n");
  for (local_1cc = 0; local_1cc < local_14; local_1cc = local_1cc + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  poVar1 = std::operator<<((ostream *)local_190,"    -id                  : ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 8));
  std::operator<<(poVar1,"\n");
  for (local_1d0 = 0; local_1d0 < local_14; local_1d0 = local_1d0 + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  poVar1 = std::operator<<((ostream *)local_190,"    -startByte           : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x28));
  std::operator<<(poVar1,"\n");
  for (local_1d4 = 0; local_1d4 < local_14; local_1d4 = local_1d4 + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  poVar1 = std::operator<<((ostream *)local_190,"    -startBit           : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x2c));
  std::operator<<(poVar1,"\n");
  for (local_1d8 = 0; local_1d8 < local_14; local_1d8 = local_1d8 + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  poVar1 = std::operator<<((ostream *)local_190,"    -type                : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x30));
  std::operator<<(poVar1,"\n");
  for (local_1dc = 0; local_1dc < local_14; local_1dc = local_1dc + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  poVar1 = std::operator<<((ostream *)local_190,"    -interleavedDataByte : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x34));
  std::operator<<(poVar1,"\n");
  for (local_1e0 = 0; local_1e0 < local_14; local_1e0 = local_1e0 + 1) {
    std::operator<<((ostream *)local_190,local_1b0);
  }
  poVar1 = std::operator<<((ostream *)local_190,"    -interleavedDataBit  : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x38));
  std::operator<<(poVar1,"\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string NDeviceChannel::getPrintStr(int indent) {
    std::ostringstream oss;
    std::string indentStr = "    ";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "Printing 'NDevice Channel'\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -id                  : " << id << "\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -startByte           : " << startByte << "\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -startBit           : " << startBit << "\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -type                : " << type << "\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -interleavedDataByte : " << interleavedDataByte << "\n";
    for (int i = 0; i < indent; i++) { oss << indentStr; }
    oss << "    -interleavedDataBit  : " << interleavedDataBit << "\n";
    return(oss.str());
}